

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

void __thiscall
cbtAlignedObjectArray<cbtAlignedObjectArray<double>_>::~cbtAlignedObjectArray
          (cbtAlignedObjectArray<cbtAlignedObjectArray<double>_> *this)

{
  clear(this);
  return;
}

Assistant:

~cbtAlignedObjectArray()
	{
		clear();
	}